

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O0

void __thiscall
amrex::MLEBABecLap::setEBDirichlet
          (MLEBABecLap *this,int amrlev,MultiFab *phi,
          Vector<double,_std::allocator<double>_> *hv_beta)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  pointer pFVar4;
  iterator pdVar5;
  MFItInfo *pMVar6;
  long *in_RDI;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Array4<const_amrex::EBCellFlag> *flag;
  Array4<const_double> *phiin;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  FabType t;
  Array4<double> *betaout;
  Array4<double> *phiout;
  Box *bx;
  MFIter mfi;
  MFItInfo mfi_info;
  Real *beta;
  DeviceVector<Real> dv_beta;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  int mglev_1;
  int ngrow;
  int mglev;
  bool phi_on_centroid;
  int ncomp;
  MFIter *in_stack_fffffffffffff9b8;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  MFItInfo *in_stack_fffffffffffff9d0;
  undefined1 cross;
  MFIter *in_stack_fffffffffffff9d8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9ec;
  int *in_stack_fffffffffffff9f0;
  Geometry *this_00;
  int *in_stack_fffffffffffff9f8;
  DistributionMapping *in_stack_fffffffffffffa00;
  BoxArray *in_stack_fffffffffffffa08;
  MFIter *in_stack_fffffffffffffa20;
  int local_580;
  int local_57c;
  int local_578;
  int local_574;
  undefined8 in_stack_fffffffffffffae0;
  undefined8 in_stack_fffffffffffffae8;
  MFItInfo local_4e8 [3];
  MFItInfo *local_4a8;
  int local_4a0;
  int local_49c;
  int local_498;
  int local_494;
  undefined8 local_490;
  int local_488;
  undefined8 local_47c;
  int local_474;
  BARef *local_470;
  int local_468;
  RefID local_460;
  int local_458;
  FabType local_454;
  long local_450 [8];
  long *local_410;
  undefined1 local_408 [64];
  __uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_3c8;
  int local_3bc [7];
  int *local_3a0;
  MFIter local_398;
  MFItInfo local_334;
  double *local_320;
  double *local_318;
  double *local_310;
  Geometry local_300;
  undefined8 local_228;
  int local_220;
  int *local_218;
  int local_20c;
  int iStack_208;
  int local_204;
  BARef *local_200;
  int local_1f8;
  int *local_1f0;
  int local_1e4;
  int iStack_1e0;
  int local_1dc;
  undefined8 local_1d8;
  int local_1d0;
  int *local_1c8;
  int local_1bc;
  int iStack_1b8;
  int local_1b4;
  undefined8 local_1b0;
  int local_1a8;
  int *local_1a0;
  int local_194;
  int iStack_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  long *local_178;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  tuple<amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_160;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  long *local_148;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  tuple<amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  long *local_118;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  FBData<amrex::FArrayBox> *local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  FabArray<amrex::FArrayBox> *local_e8;
  uint *local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  MFItInfo *local_c8;
  undefined4 local_bc;
  int *local_b8;
  undefined4 local_ac;
  int *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  int *local_88;
  undefined4 local_7c;
  int *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_300.domain.smallend.vect[2] = (**(code **)(*in_RDI + 0x28))();
  local_300.domain.smallend.vect[1]._3_1_ = *(int *)((long)in_RDI + 0x32c) == 3;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
  bVar2 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  if (bVar2) {
    local_300.domain.smallend.vect[0] = 0;
    local_300.roundoff_hi_f.arr[2] = (float)(local_300.domain.smallend.vect[1]._3_1_ & 1);
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
    local_300.roundoff_hi_d.arr[0] = 0.0;
    local_300.roundoff_hi_d.arr[1] = 0.0;
    local_300.prob_domain.xhi[1] = 0.0;
    local_300.prob_domain.xhi[2] = 0.0;
    local_300.roundoff_hi_d.arr[2] = 0.0;
    MFInfo::MFInfo((MFInfo *)0x177c2ac);
    Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                  *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
    Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                  *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
    in_stack_fffffffffffff9b8 =
         (MFIter *)
         std::
         unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      *)in_stack_fffffffffffff9c0);
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
              (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
               in_stack_fffffffffffff9f0,
               (MFInfo *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffa20);
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff9c0,
               (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff9b8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff9c0);
    MFInfo::~MFInfo((MFInfo *)0x177c375);
  }
  Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
  bVar2 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  if (bVar2) {
    for (local_300.prob_domain.xlo[2]._0_4_ = 0; iVar1 = local_300.prob_domain.xlo[2]._0_4_,
        piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c0,
                            (size_type)in_stack_fffffffffffff9b8), iVar1 < *piVar3;
        local_300.prob_domain.xlo[2]._0_4_ = local_300.prob_domain.xlo[2]._0_4_ + 1) {
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
      Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
      in_stack_fffffffffffffa20 =
           (MFIter *)
           Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
           operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                       *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
      local_300.prob_domain.xlo[0]._4_4_ = 0;
      local_300.super_CoordSys.inv_dx[0] = 0.0;
      local_300.super_CoordSys.inv_dx[1] = 0.0;
      local_300.super_CoordSys.dx[1] = 0.0;
      local_300.super_CoordSys.dx[2] = 0.0;
      local_300.super_CoordSys.inv_dx[2] = 0.0;
      MFInfo::MFInfo((MFInfo *)0x177c4b1);
      Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
      Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
      in_stack_fffffffffffff9b8 =
           (MFIter *)
           std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        *)in_stack_fffffffffffff9c0);
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
                (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                 in_stack_fffffffffffff9f0,
                 (MFInfo *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                 (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffa20);
      Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                    *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff9c0,
                 (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff9b8);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff9c0);
      MFInfo::~MFInfo((MFInfo *)0x177c57e);
    }
  }
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
  Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
  pFVar4 = std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  *)in_stack_fffffffffffff9c0);
  if (pFVar4 == (pointer)0x0) {
    local_300.super_CoordSys.dx[0] = 0.0;
  }
  else {
    local_300.super_CoordSys.dx[0] =
         (Real)__dynamic_cast(pFVar4,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0);
  }
  if (local_300.super_CoordSys.dx[0] == 0.0) {
    local_300.super_CoordSys.offset[2] = 0.0;
  }
  else {
    local_300.super_CoordSys.offset[2] =
         (Real)EBFArrayBoxFactory::getMultiEBCellFlagFab
                         ((EBFArrayBoxFactory *)in_stack_fffffffffffff9c0);
  }
  Vector<double,_std::allocator<double>_>::size
            ((Vector<double,_std::allocator<double>_> *)0x177c672);
  this_00 = &local_300;
  PODVector<double,_std::allocator<double>_>::PODVector
            ((PODVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9c0,
             (size_type)in_stack_fffffffffffff9b8);
  local_310 = (double *)
              std::vector<double,_std::allocator<double>_>::begin
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9b8);
  local_318 = (double *)
              std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9b8);
  pdVar5 = PODVector<double,_std::allocator<double>_>::begin
                     ((PODVector<double,_std::allocator<double>_> *)this_00);
  Gpu::
  copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double*>
            (local_310,local_318,pdVar5);
  local_320 = PODVector<double,_std::allocator<double>_>::data
                        ((PODVector<double,_std::allocator<double>_> *)this_00);
  pMVar6 = &local_334;
  MFItInfo::MFItInfo(in_stack_fffffffffffff9d0);
  pMVar6 = MFItInfo::EnableTiling(pMVar6,(IntVect *)&FabArrayBase::mfiter_tile_size);
  MFItInfo::SetDynamic(pMVar6,true);
  MFIter::MFIter((MFIter *)this_00,
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                 (MFItInfo *)in_stack_fffffffffffff9e0);
  while( true ) {
    bVar2 = MFIter::isValid(&local_398);
    cross = (undefined1)((ulong)in_stack_fffffffffffff9d0 >> 0x38);
    if (!bVar2) break;
    MFIter::tilebox(in_stack_fffffffffffffa20);
    local_3a0 = local_3bc;
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x177c7c5);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (MFIter *)in_stack_fffffffffffff9c0);
    local_3c8._M_t.
    super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
         (tuple<amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
          )local_408;
    Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x177c81d);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (MFIter *)in_stack_fffffffffffff9c0);
    local_410 = local_450;
    if ((FabArray<amrex::EBCellFlagFab> *)local_300.super_CoordSys.offset[2] ==
        (FabArray<amrex::EBCellFlagFab> *)0x0) {
      local_454 = regular;
    }
    else {
      FabArray<amrex::EBCellFlagFab>::operator[]
                (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      local_454 = EBCellFlagFab::getType
                            ((EBCellFlagFab *)in_stack_fffffffffffffae8,
                             (Box *)in_stack_fffffffffffffae0);
    }
    if ((local_454 == regular) || (local_454 == covered)) {
      local_1f0 = local_3a0;
      local_38 = local_3a0;
      local_3c = 0;
      local_1e4 = *local_3a0;
      local_48 = local_3a0;
      local_4c = 1;
      iStack_1e0 = local_3a0[1];
      local_470 = *(BARef **)local_3a0;
      local_58 = local_3a0;
      local_5c = 2;
      local_468 = local_3a0[2];
      local_1a0 = local_3a0;
      local_98 = local_3a0 + 3;
      local_9c = 0;
      local_194 = *local_98;
      local_a8 = local_3a0 + 3;
      local_ac = 1;
      iStack_190 = local_3a0[4];
      local_490._0_4_ = local_98[0];
      local_490._4_4_ = local_98[1];
      local_b8 = local_3a0 + 3;
      local_bc = 2;
      local_488 = local_3a0[5];
      for (local_494 = 0; iVar1 = local_468, local_47c = local_490, local_474 = local_488,
          local_460.data = local_470, local_458 = local_468, local_200 = local_470,
          local_1f8 = local_468, local_1dc = local_468, local_1b0 = local_490, local_1a8 = local_488
          , local_18c = local_488, local_494 < local_300.domain.smallend.vect[2];
          local_494 = local_494 + 1) {
        while (local_498 = iVar1, iVar1 = iStack_1e0, local_498 <= local_488) {
          while (local_49c = iVar1, iVar1 = local_1e4, local_49c <= iStack_190) {
            while (local_4a0 = iVar1, local_4a0 <= local_194) {
              local_100 = (FBData<amrex::FArrayBox> *)
                          local_3c8._M_t.
                          super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                          .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>.
                          _M_head_impl;
              local_104 = local_4a0;
              local_108 = local_49c;
              local_10c = local_498;
              local_110 = local_494;
              *(undefined8 *)
               (*(long *)local_3c8._M_t.
                         super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>.
                         _M_head_impl +
               ((long)(local_4a0 -
                      *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                ((long)local_3c8._M_t.
                                       super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                       .
                                       super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                       ._M_head_impl + 0x20))->
                               super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) +
                (long)(local_49c -
                      *(int *)((long)local_3c8._M_t.
                                     super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                     .
                                     super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                     ._M_head_impl + 0x24)) *
                *(long *)((long)local_3c8._M_t.
                                super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>.
                                _M_head_impl + 8) +
                (long)(local_498 -
                      *(int *)((long)local_3c8._M_t.
                                     super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                     .
                                     super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                     ._M_head_impl + 0x28)) *
                (long)*(char **)((long)local_3c8._M_t.
                                       super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                       .
                                       super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                       ._M_head_impl + 0x10) +
               (long)local_494 *
               (long)*(char **)((long)local_3c8._M_t.
                                      super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                      .
                                      super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                      ._M_head_impl + 0x18)) * 8) = 0;
              local_118 = local_410;
              local_11c = local_4a0;
              local_120 = local_49c;
              local_124 = local_498;
              local_128 = local_494;
              *(undefined8 *)
               (*local_410 +
               ((long)(local_4a0 - (int)local_410[4]) +
                (long)(local_49c - *(int *)((long)local_410 + 0x24)) * local_410[1] +
                (long)(local_498 - (int)local_410[5]) * local_410[2] +
               (long)local_494 * local_410[3]) * 8) = 0;
              iVar1 = local_4a0 + 1;
            }
            iVar1 = local_49c + 1;
          }
          iVar1 = local_498 + 1;
        }
      }
    }
    else {
      in_stack_fffffffffffff9d0 = local_4e8;
      in_stack_fffffffffffff9d8 = &local_398;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                 (MFIter *)in_stack_fffffffffffff9c0);
      in_stack_fffffffffffff9e0 = (FabArray<amrex::FArrayBox> *)&stack0xfffffffffffffad0;
      local_4a8 = in_stack_fffffffffffff9d0;
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                ((FabArray<amrex::EBCellFlagFab> *)
                 CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                 (MFIter *)in_stack_fffffffffffff9c0);
      local_218 = local_3a0;
      local_8 = local_3a0;
      local_c = 0;
      local_20c = *local_3a0;
      local_18 = local_3a0;
      local_1c = 1;
      iStack_208 = local_3a0[1];
      local_228 = *(undefined8 *)local_3a0;
      local_28 = local_3a0;
      local_2c = 2;
      local_220 = local_3a0[2];
      local_1c8 = local_3a0;
      local_68 = local_3a0 + 3;
      local_6c = 0;
      local_1bc = *local_68;
      local_78 = local_3a0 + 3;
      local_7c = 1;
      iStack_1b8 = local_3a0[4];
      local_1d8 = *(undefined8 *)local_68;
      local_88 = local_3a0 + 3;
      local_8c = 2;
      local_1d0 = local_3a0[5];
      for (local_574 = 0; local_578 = local_220, local_204 = local_220, local_1b4 = local_1d0,
          local_574 < local_300.domain.smallend.vect[2]; local_574 = local_574 + 1) {
        for (; local_57c = iStack_208, local_578 <= local_1d0; local_578 = local_578 + 1) {
          for (; local_580 = local_20c, local_57c <= iStack_1b8; local_57c = local_57c + 1) {
            for (; local_580 <= local_1bc; local_580 = local_580 + 1) {
              local_ec = local_580;
              local_f0 = local_57c;
              local_f4 = local_578;
              local_e0 = (uint *)((long)(in_stack_fffffffffffff9e0->super_FabArrayBase).
                                        _vptr_FabArrayBase +
                                 ((long)(local_580 -
                                        (in_stack_fffffffffffff9e0->super_FabArrayBase).boxarray.
                                        m_bat.m_op.m_bndryReg.m_loshft.vect[0]) +
                                  (long)(local_57c -
                                        (in_stack_fffffffffffff9e0->super_FabArrayBase).boxarray.
                                        m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                                  *(long *)&(in_stack_fffffffffffff9e0->super_FabArrayBase).boxarray
                                            .m_bat +
                                 (long)(local_578 -
                                       (in_stack_fffffffffffff9e0->super_FabArrayBase).boxarray.
                                       m_bat.m_op.m_bndryReg.m_loshft.vect[2]) *
                                 *(long *)((long)&(in_stack_fffffffffffff9e0->super_FabArrayBase).
                                                  boxarray.m_bat.m_op + 4)) * 4);
              if ((*local_e0 & 3) == 1) {
                local_c8 = local_4a8;
                local_cc = local_580;
                local_d0 = local_57c;
                local_d4 = local_578;
                local_d8 = local_574;
                local_130.
                super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
                     (_Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                      )(_Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                        )local_3c8._M_t.
                         super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>.
                         _M_head_impl;
                local_134 = local_580;
                local_138 = local_57c;
                local_13c = local_578;
                local_140 = local_574;
                *(undefined8 *)
                 (*(long *)local_3c8._M_t.
                           super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>.
                           _M_head_impl +
                 ((long)(local_580 -
                        *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                  ((long)local_3c8._M_t.
                                         super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                         .
                                         super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                         ._M_head_impl + 0x20))->
                                 super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) +
                  (long)(local_57c -
                        *(int *)((long)local_3c8._M_t.
                                       super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                       .
                                       super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                       ._M_head_impl + 0x24)) *
                  *(long *)((long)local_3c8._M_t.
                                  super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                  .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>.
                                  _M_head_impl + 8) +
                  (long)(local_578 -
                        *(int *)((long)local_3c8._M_t.
                                       super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                       .
                                       super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                       ._M_head_impl + 0x28)) *
                  (long)*(char **)((long)local_3c8._M_t.
                                         super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                         .
                                         super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                         ._M_head_impl + 0x10) +
                 (long)local_574 *
                 (long)*(char **)((long)local_3c8._M_t.
                                        super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                        .
                                        super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                        ._M_head_impl + 0x18)) * 8) =
                     *(undefined8 *)
                      (*(long *)local_4a8 +
                      ((long)(local_580 - local_4a8[1].tilesize.vect[1]) +
                       (long)(local_57c - local_4a8[1].tilesize.vect[2]) *
                       *(long *)(local_4a8->tilesize).vect +
                       (long)(local_578 - *(int *)(local_4a8 + 2)) *
                       *(long *)((local_4a8->tilesize).vect + 2) +
                      (long)local_574 * *(long *)&local_4a8[1].num_streams) * 8);
                local_148 = local_410;
                local_14c = local_580;
                local_150 = local_57c;
                local_154 = local_578;
                local_158 = local_574;
                *(double *)
                 (*local_410 +
                 ((long)(local_580 - (int)local_410[4]) +
                  (long)(local_57c - *(int *)((long)local_410 + 0x24)) * local_410[1] +
                  (long)(local_578 - (int)local_410[5]) * local_410[2] +
                 (long)local_574 * local_410[3]) * 8) = local_320[local_574];
              }
              else {
                local_160.
                super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
                     (_Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                      )(_Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                        )local_3c8._M_t.
                         super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>.
                         _M_head_impl;
                local_164 = local_580;
                local_168 = local_57c;
                local_16c = local_578;
                local_170 = local_574;
                *(undefined8 *)
                 (*(long *)local_3c8._M_t.
                           super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>.
                           _M_head_impl +
                 ((long)(local_580 -
                        *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                  ((long)local_3c8._M_t.
                                         super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                         .
                                         super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                         ._M_head_impl + 0x20))->
                                 super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) +
                  (long)(local_57c -
                        *(int *)((long)local_3c8._M_t.
                                       super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                       .
                                       super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                       ._M_head_impl + 0x24)) *
                  *(long *)((long)local_3c8._M_t.
                                  super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                  .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>.
                                  _M_head_impl + 8) +
                  (long)(local_578 -
                        *(int *)((long)local_3c8._M_t.
                                       super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                       .
                                       super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                       ._M_head_impl + 0x28)) *
                  (long)*(char **)((long)local_3c8._M_t.
                                         super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                         .
                                         super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                         ._M_head_impl + 0x10) +
                 (long)local_574 *
                 (long)*(char **)((long)local_3c8._M_t.
                                        super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                        .
                                        super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>
                                        ._M_head_impl + 0x18)) * 8) = 0;
                local_178 = local_410;
                local_17c = local_580;
                local_180 = local_57c;
                local_184 = local_578;
                local_188 = local_574;
                *(undefined8 *)
                 (*local_410 +
                 ((long)(local_580 - (int)local_410[4]) +
                  (long)(local_57c - *(int *)((long)local_410 + 0x24)) * local_410[1] +
                  (long)(local_578 - (int)local_410[5]) * local_410[2] +
                 (long)local_574 * local_410[3]) * 8) = 0;
              }
              local_e8 = in_stack_fffffffffffff9e0;
            }
          }
        }
      }
    }
    MFIter::operator++(&local_398);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffff9c0);
  if ((local_300.domain.smallend.vect[1]._3_1_ & 1) != 0) {
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
    in_stack_fffffffffffff9c0 =
         (FabArray<amrex::EBCellFlagFab> *)
         std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                   ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x177d47c)
    ;
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_fffffffffffff9c0,(size_type)in_stack_fffffffffffff9b8);
    Geometry::periodicity(this_00);
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_fffffffffffff9e0,(Periodicity *)in_stack_fffffffffffff9d8,(bool)cross);
  }
  PODVector<double,_std::allocator<double>_>::~PODVector
            ((PODVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9c0);
  return;
}

Assistant:

void
MLEBABecLap::setEBDirichlet (int amrlev, const MultiFab& phi, Vector<Real> const& hv_beta)
{
    const int ncomp = getNComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    Gpu::DeviceVector<Real> dv_beta(hv_beta.size());
    Gpu::copy(Gpu::hostToDevice, hv_beta.begin(), hv_beta.end(), dv_beta.begin());
    Real const* beta = dv_beta.data();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phiout = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                phiout(i,j,k,n) = 0.0;
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            Array4<Real const> const& phiin = phi.const_array(mfi);
            const auto& flag = flags->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flag(i,j,k).isSingleValued()) {
                    phiout(i,j,k,n) = phiin(i,j,k,n);
                    betaout(i,j,k,n) = beta[n];
                } else {
                    phiout(i,j,k,n) = 0.0;
                    betaout(i,j,k,n) = 0.0;
                }
            });
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}